

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# licensecc.cpp
# Opt level: O0

bool identify_pc(LCC_API_HW_IDENTIFICATION_STRATEGY pc_id_method,char *chbuffer,size_t *bufSize,
                ExecutionEnvironmentInfo *execution_environment_info)

{
  int iVar1;
  LCC_API_CLOUD_PROVIDER LVar2;
  LCC_API_VIRTUALIZATION_SUMMARY LVar3;
  LCC_API_VIRTUALIZATION_DETAIL LVar4;
  char *src;
  exception *ex;
  undefined1 local_50 [8];
  string pc_id;
  bool result;
  ExecutionEnvironmentInfo *execution_environment_info_local;
  size_t *bufSize_local;
  char *chbuffer_local;
  LCC_API_HW_IDENTIFICATION_STRATEGY pc_id_method_local;
  
  pc_id.field_2._M_local_buf[0xf] = '\0';
  if ((*bufSize < 0x14) || (chbuffer == (char *)0x0)) {
    *bufSize = 0x14;
  }
  else {
    license::hw_identifier::HwIdentifierFacade::generate_user_pc_signature_abi_cxx11_
              ((string *)local_50,(HwIdentifierFacade *)(ulong)(uint)pc_id_method,
               (LCC_API_HW_IDENTIFICATION_STRATEGY)bufSize);
    src = (char *)std::__cxx11::string::c_str();
    license::mstrlcpy(chbuffer,src,*bufSize);
    pc_id.field_2._M_local_buf[0xf] = '\x01';
    std::__cxx11::string::~string((string *)local_50);
  }
  if (identify_pc::exec_env == '\0') {
    iVar1 = __cxa_guard_acquire(&identify_pc::exec_env);
    if (iVar1 != 0) {
      license::os::ExecutionEnvironment::ExecutionEnvironment(&identify_pc::exec_env);
      __cxa_atexit(license::os::ExecutionEnvironment::~ExecutionEnvironment,&identify_pc::exec_env,
                   &__dso_handle);
      __cxa_guard_release(&identify_pc::exec_env);
    }
  }
  if (execution_environment_info != (ExecutionEnvironmentInfo *)0x0) {
    LVar2 = license::os::ExecutionEnvironment::cloud_provider(&identify_pc::exec_env);
    execution_environment_info->cloud_provider = LVar2;
    LVar3 = license::os::ExecutionEnvironment::virtualization(&identify_pc::exec_env);
    execution_environment_info->virtualization = LVar3;
    LVar4 = license::os::ExecutionEnvironment::virtualization_detail(&identify_pc::exec_env);
    execution_environment_info->virtualization_detail = LVar4;
  }
  return (bool)(pc_id.field_2._M_local_buf[0xf] & 1);
}

Assistant:

bool identify_pc(LCC_API_HW_IDENTIFICATION_STRATEGY pc_id_method, char* chbuffer, size_t* bufSize,
				 ExecutionEnvironmentInfo* execution_environment_info) {
	bool result = false;
	if (*bufSize > LCC_API_PC_IDENTIFIER_SIZE && chbuffer != nullptr) {
		try {
			const string pc_id = license::hw_identifier::HwIdentifierFacade::generate_user_pc_signature(pc_id_method);
			license::mstrlcpy(chbuffer, pc_id.c_str(), *bufSize);
			result = true;
		} catch (const std::exception& ex) {
			LOG_ERROR("Error calculating hw_identifier: %s", ex.what());
#ifndef NDEBUG
			cerr << "Error occurred in identify_pc: " << ex.what() << std::endl;
#endif
		}
	} else {
		*bufSize = LCC_API_PC_IDENTIFIER_SIZE + 1;
	}
	static const license::os::ExecutionEnvironment exec_env;
	if (execution_environment_info != nullptr) {
		execution_environment_info->cloud_provider = exec_env.cloud_provider();
		execution_environment_info->virtualization = exec_env.virtualization();
		execution_environment_info->virtualization_detail = exec_env.virtualization_detail();
	}
	return result;
}